

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O1

void Kit_DsdTruth(Kit_DsdNtk_t *pNtk,uint *pTruthRes)

{
  undefined2 uVar1;
  Kit_DsdMan_t *p;
  uint *puVar2;
  long lVar3;
  uint uVar4;
  
  p = Kit_DsdManAlloc((uint)pNtk->nVars,(uint)pNtk->nNodes + (uint)pNtk->nVars);
  puVar2 = Kit_DsdTruthCompute(p,pNtk);
  uVar1 = pNtk->nVars;
  uVar4 = 1 << ((char)uVar1 - 5U & 0x1f);
  if ((ushort)uVar1 < 6) {
    uVar4 = 1;
  }
  if (0 < (int)uVar4) {
    lVar3 = (ulong)uVar4 + 1;
    do {
      pTruthRes[lVar3 + -2] = puVar2[lVar3 + -2];
      lVar3 = lVar3 + -1;
    } while (1 < lVar3);
  }
  Kit_DsdManFree(p);
  return;
}

Assistant:

void Kit_DsdTruth( Kit_DsdNtk_t * pNtk, unsigned * pTruthRes )
{
    Kit_DsdMan_t * p;
    unsigned * pTruth;
    p = Kit_DsdManAlloc( pNtk->nVars, Kit_DsdNtkObjNum(pNtk) );
    pTruth = Kit_DsdTruthCompute( p, pNtk );
    Kit_TruthCopy( pTruthRes, pTruth, pNtk->nVars );
    Kit_DsdManFree( p );
}